

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O2

int sfile_read(jas_stream_obj_t *obj,char *buf,uint cnt)

{
  int iVar1;
  size_t sVar2;
  
  iVar1 = jas_getdbglevel();
  if (99 < iVar1) {
    jas_eprintf("sfile_read(%p, %p, %u)\n",obj,buf,(ulong)cnt);
  }
  sVar2 = fread(buf,1,(ulong)cnt,(FILE *)obj);
  if (sVar2 != cnt) {
    iVar1 = ferror((FILE *)obj);
    if (iVar1 == 0) {
      feof((FILE *)obj);
    }
  }
  return (int)sVar2;
}

Assistant:

static int sfile_read(jas_stream_obj_t *obj, char *buf, unsigned cnt)
{
	FILE *fp;
	size_t n;
	int result;
	JAS_DBGLOG(100, ("sfile_read(%p, %p, %u)\n", obj, buf, cnt));
	fp = JAS_CAST(FILE *, obj);
	n = fread(buf, 1, cnt, fp);
	if (n != cnt) {
		result = (!ferror(fp) && feof(fp)) ? 0 : -1;
	}
	result = JAS_CAST(int, n);
	return result;
}